

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource_iterator.cpp
# Opt level: O3

QFileInfo __thiscall QResourceFileEngineIterator::currentFileInfo(QResourceFileEngineIterator *this)

{
  totally_ordered_wrapper<QFileInfoPrivate_*> tVar1;
  long *in_RSI;
  long in_FS_OFFSET;
  QString local_40;
  QSharedDataPointer<QFileInfoPrivate> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*in_RSI + 0x28))(&local_40);
  QFileInfo::QFileInfo((QFileInfo *)&local_28,&local_40);
  tVar1.ptr = (QFileInfoPrivate *)in_RSI[1];
  ((totally_ordered_wrapper<QFileInfoPrivate_*> *)(in_RSI + 1))->ptr =
       (QFileInfoPrivate *)local_28.d.ptr;
  local_28.d.ptr =
       (totally_ordered_wrapper<QFileInfoPrivate_*>)
       (totally_ordered_wrapper<QFileInfoPrivate_*>)tVar1.ptr;
  QFileInfo::~QFileInfo((QFileInfo *)&local_28);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  QFileInfo::QFileInfo((QFileInfo *)this,(QFileInfo *)(in_RSI + 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QSharedDataPointer<QFileInfoPrivate>)(QSharedDataPointer<QFileInfoPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QFileInfo QResourceFileEngineIterator::currentFileInfo() const
{
    m_fileInfo = QFileInfo(currentFilePath());
    return m_fileInfo;
}